

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pricing_session.cpp
# Opt level: O3

vector<bidfx_public_api::price::provider::ProviderProperties,_std::allocator<bidfx_public_api::price::provider::ProviderProperties>_>
* __thiscall
bidfx_public_api::price::PricingSession::GetProviderProperties
          (vector<bidfx_public_api::price::provider::ProviderProperties,_std::allocator<bidfx_public_api::price::provider::ProviderProperties>_>
           *__return_storage_ptr__,PricingSession *this)

{
  initializer_list<bidfx_public_api::price::provider::ProviderProperties> __l;
  allocator_type local_59;
  ProviderProperties local_58;
  
  (*(this->pixie_provider_->super_Subscriber)._vptr_Subscriber[8])(&local_58);
  __l._M_len = 1;
  __l._M_array = &local_58;
  std::
  vector<bidfx_public_api::price::provider::ProviderProperties,_std::allocator<bidfx_public_api::price::provider::ProviderProperties>_>
  ::vector(__return_storage_ptr__,__l,&local_59);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.explanation_._M_dataplus._M_p != &local_58.explanation_.field_2) {
    operator_delete(local_58.explanation_._M_dataplus._M_p,
                    local_58.explanation_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.name_._M_dataplus._M_p != &local_58.name_.field_2) {
    operator_delete(local_58.name_._M_dataplus._M_p,local_58.name_.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ProviderProperties> PricingSession::GetProviderProperties()
{
    return {pixie_provider_->GetProperties()};
}